

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GlobalPooling3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_globalpooling3d
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  GlobalPooling3DLayerParams *pGVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_globalpooling3d(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_globalpooling3d(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pGVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::GlobalPooling3DLayerParams>(arena);
    (this->layer_).globalpooling3d_ = pGVar2;
  }
  return (GlobalPooling3DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GlobalPooling3DLayerParams* NeuralNetworkLayer::_internal_mutable_globalpooling3d() {
  if (!_internal_has_globalpooling3d()) {
    clear_layer();
    set_has_globalpooling3d();
    layer_.globalpooling3d_ = CreateMaybeMessage< ::CoreML::Specification::GlobalPooling3DLayerParams >(GetArenaForAllocation());
  }
  return layer_.globalpooling3d_;
}